

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O0

bool __thiscall
ON_3dPointArray::Create
          (ON_3dPointArray *this,int point_dimension,int bRational,int point_count,int point_stride,
          float *points)

{
  float fVar1;
  ON_3dPoint *pOVar2;
  int local_74;
  undefined1 local_68 [8];
  ON_4dPoint h;
  ON_3dPoint q;
  int i;
  bool rc;
  float *points_local;
  int point_stride_local;
  int point_count_local;
  int bRational_local;
  int point_dimension_local;
  ON_3dPointArray *this_local;
  
  q.z._7_1_ = false;
  local_74 = point_dimension;
  if ((((1 < point_dimension) && (point_dimension < 4)) && (0 < point_count)) &&
     ((points != (float *)0x0 && (bRational <= point_stride)))) {
    local_74 = point_dimension + 1;
  }
  if (local_74 == 0) {
    ON_SimpleArray<ON_3dPoint>::Destroy(&this->super_ON_SimpleArray<ON_3dPoint>);
  }
  else {
    q.z._7_1_ = true;
    ON_3dPoint::ON_3dPoint((ON_3dPoint *)&h.w,0.0,0.0,0.0);
    ON_4dPoint::ON_4dPoint((ON_4dPoint *)local_68,0.0,0.0,0.0,1.0);
    (this->super_ON_SimpleArray<ON_3dPoint>).m_count = 0;
    ON_SimpleArray<ON_3dPoint>::SetCapacity
              (&this->super_ON_SimpleArray<ON_3dPoint>,(long)point_count);
    ON_SimpleArray<ON_3dPoint>::SetCount(&this->super_ON_SimpleArray<ON_3dPoint>,point_count);
    _i = points;
    if (bRational == 0) {
      for (q.z._0_4_ = 0; q.z._0_4_ < point_count; q.z._0_4_ = q.z._0_4_ + 1) {
        fVar1 = _i[1];
        if (point_dimension == 3) {
          q.y = (double)_i[2];
        }
        pOVar2 = (this->super_ON_SimpleArray<ON_3dPoint>).m_a + q.z._0_4_;
        pOVar2->x = (double)*_i;
        pOVar2->y = (double)fVar1;
        pOVar2->z = q.y;
        _i = _i + point_stride;
      }
    }
    else {
      for (q.z._0_4_ = 0; q.z._0_4_ < point_count; q.z._0_4_ = q.z._0_4_ + 1) {
        local_68 = (undefined1  [8])(double)*_i;
        h.x = (double)_i[1];
        if (point_dimension == 3) {
          h.y = (double)_i[2];
        }
        h.z = (double)_i[point_dimension];
        ON_3dPoint::operator=
                  ((this->super_ON_SimpleArray<ON_3dPoint>).m_a + q.z._0_4_,(ON_4dPoint *)local_68);
        _i = _i + point_stride;
      }
    }
  }
  return q.z._7_1_;
}

Assistant:

bool ON_3dPointArray::Create( 
  int point_dimension,
  int bRational,
  int point_count,
  int point_stride,
  const float* points
  )
{
  bool rc = false;
  if (     point_dimension >= 2 && point_dimension <= 3 
        && point_count>0 && points 
        && point_stride >= bRational?(point_dimension+1):point_dimension )
  {
    rc = true;
    int i;
    ON_3dPoint q(0.0,0.0,0.0);
    ON_4dPoint h(0.0,0.0,0.0,1.0);
    m_count = 0;
    SetCapacity(point_count);
    SetCount(point_count);
    if ( bRational )
    {
      for ( i = 0; i < point_count; i++ )
      {
        h.x = points[0];
        h.y = points[1];
        if ( point_dimension == 3 )
          h.z = points[2];
        h.w = points[point_dimension];
        m_a[i] = h;
        points += point_stride;
      }
    }
    else
    {
      for ( i = 0; i < point_count; i++ )
      {
        q.x = points[0];
        q.y = points[1];
        if ( point_dimension == 3 )
          q.z = points[2];
        m_a[i] = q;
        points += point_stride;
      }
    }
  }
  else
    Destroy();
  return rc;
}